

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_grpc.cpp
# Opt level: O2

bool __thiscall flatbuffers::JavaGRPCGenerator::generate(JavaGRPCGenerator *this)

{
  ServiceDef *__rhs;
  Namespace *this_00;
  long lVar1;
  bool bVar2;
  long lVar3;
  pointer *__ptr;
  Parameters *in_R8;
  string filename;
  Parameters p;
  FlatBufFile file;
  string output;
  undefined1 local_108 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 *local_d0;
  undefined8 local_c8;
  undefined1 local_c0 [16];
  undefined **local_b0;
  Parser *local_a8;
  string *local_a0;
  undefined4 local_98;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  local_a8 = (this->super_BaseGenerator).parser_;
  local_a0 = (this->super_BaseGenerator).file_name_;
  local_b0 = &PTR__CommentHolder_002fb398;
  local_d0 = local_c0;
  local_c8 = 0;
  local_98 = 2;
  local_c0[0] = 0;
  lVar1 = 0;
  local_108._8_8_ = this;
  do {
    lVar3 = lVar1;
    local_108._16_8_ =
         SEXT48((int)((ulong)((long)(local_a8->services_).vec.
                                    super__Vector_base<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(local_a8->services_).vec.
                                   super__Vector_base<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3));
    if ((long)local_108._16_8_ <= lVar3) break;
    FlatBufFile::service((FlatBufFile *)local_108,(int)&local_b0);
    __rhs = (((BaseGenerator *)local_108._8_8_)->parser_->services_).vec.
            super__Vector_base<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar3];
    this_00 = (__rhs->super_Definition).defined_namespace;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"",(allocator<char> *)&local_70);
    Namespace::GetFullyQualifiedName(&local_50,this_00,&local_f0,1000);
    std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_f0);
    grpc_java_generator::GenerateServiceSource_abi_cxx11_
              (&local_50,(grpc_java_generator *)&local_b0,(File *)local_108._0_8_,
               (Service *)&local_d0,in_R8);
    BaseGenerator::NamespaceDir_abi_cxx11_
              (&local_90,(BaseGenerator *)local_108._8_8_,
               (__rhs->super_Definition).defined_namespace,false);
    std::operator+(&local_70,&local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
    std::operator+(&local_f0,&local_70,"Grpc.java");
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    bVar2 = SaveFile(local_f0._M_dataplus._M_p,&local_50,false);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_50);
    if ((_func_int **)local_108._0_8_ != (_func_int **)0x0) {
      (*(*(_func_int ***)local_108._0_8_)[1])();
    }
    lVar1 = lVar3 + 1;
  } while (bVar2);
  bVar2 = (long)local_108._16_8_ <= lVar3;
  std::__cxx11::string::~string((string *)&local_d0);
  return bVar2;
}

Assistant:

bool generate() {
    FlatBufFile file(parser_, file_name_, FlatBufFile::kLanguageJava);
    grpc_java_generator::Parameters p;
    for (int i = 0; i < file.service_count(); i++) {
      auto service = file.service(i);
      const Definition *def = parser_.services_.vec[i];
      p.package_name =
          def->defined_namespace->GetFullyQualifiedName("");  // file.package();
      std::string output =
          grpc_java_generator::GenerateServiceSource(&file, service.get(), &p);
      std::string filename =
          NamespaceDir(*def->defined_namespace) + def->name + "Grpc.java";
      if (!flatbuffers::SaveFile(filename.c_str(), output, false)) return false;
    }
    return true;
  }